

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_generator.cc
# Opt level: O2

string * google::protobuf::compiler::javanano::anon_unknown_5::TrimString
                   (string *__return_storage_ptr__,string *s)

{
  long lVar1;
  allocator local_19;
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)s,0x346eeb);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
  }
  else {
    std::__cxx11::string::find_last_not_of((char *)s,0x346eeb);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
  }
  return __return_storage_ptr__;
}

Assistant:

string TrimString(const string& s) {
  string::size_type start = s.find_first_not_of(" \n\r\t");
  if (start == string::npos) {
    return "";
  }
  string::size_type end = s.find_last_not_of(" \n\r\t") + 1;
  return s.substr(start, end - start);
}